

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

char * luaL_prepbuffsize(luaL_Buffer *B,size_t sz)

{
  lua_State *L_00;
  char *__dest;
  ulong local_30;
  size_t newsize;
  char *newbuff;
  lua_State *L;
  size_t sz_local;
  luaL_Buffer *B_local;
  
  L_00 = B->L;
  if (B->size - B->n < sz) {
    local_30 = B->size * 2;
    if (local_30 - B->n < sz) {
      local_30 = B->n + sz;
    }
    if ((local_30 < B->n) || (local_30 - B->n < sz)) {
      luaL_error(L_00,"buffer too large");
    }
    __dest = (char *)lua_newuserdata(L_00,local_30);
    memcpy(__dest,B->b,B->n);
    if (B->b != B->initb) {
      lua_remove(L_00,-2);
    }
    B->b = __dest;
    B->size = local_30;
  }
  return B->b + B->n;
}

Assistant:

LUALIB_API char *luaL_prepbuffsize (luaL_Buffer *B, size_t sz) {
  lua_State *L = B->L;
  if (B->size - B->n < sz) {  /* not enough space? */
    char *newbuff;
    size_t newsize = B->size * 2;  /* double buffer size */
    if (newsize - B->n < sz)  /* not big enough? */
      newsize = B->n + sz;
    if (newsize < B->n || newsize - B->n < sz)
      luaL_error(L, "buffer too large");
    /* create larger buffer */
    newbuff = (char *)lua_newuserdata(L, newsize * sizeof(char));
    /* move content to new buffer */
    memcpy(newbuff, B->b, B->n * sizeof(char));
    if (buffonstack(B))
      lua_remove(L, -2);  /* remove old buffer */
    B->b = newbuff;
    B->size = newsize;
  }
  return &B->b[B->n];
}